

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties
          (cmExportBuildAndroidMKGenerator *this,cmGeneratorTarget *target,ostream *os,
          ImportPropertyMap *properties)

{
  bool bVar1;
  reference pvVar2;
  undefined1 local_48 [8];
  string config;
  ImportPropertyMap *properties_local;
  ostream *os_local;
  cmGeneratorTarget *target_local;
  cmExportBuildAndroidMKGenerator *this_local;
  
  config.field_2._8_8_ = properties;
  std::__cxx11::string::string((string *)local_48);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&(this->super_cmExportBuildFileGenerator).super_cmExportFileGenerator.
                   Configurations);
  if (!bVar1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_cmExportBuildFileGenerator).super_cmExportFileGenerator.
                           Configurations,0);
    std::__cxx11::string::operator=((string *)local_48,(string *)pvVar2);
  }
  GenerateInterfaceProperties
            (target,os,(ImportPropertyMap *)config.field_2._8_8_,BUILD,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
  const cmGeneratorTarget* target, std::ostream& os,
  const ImportPropertyMap& properties)
{
  std::string config;
  if (!this->Configurations.empty()) {
    config = this->Configurations[0];
  }
  cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
    target, os, properties, cmExportBuildAndroidMKGenerator::BUILD, config);
}